

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O0

address_type * __thiscall
cppcms::forwarder::check_forwading_rules(forwarder *this,string *h,string *s,string *p)

{
  bool bVar1;
  address_type *in_RDI;
  const_iterator it;
  shared_lock<booster::shared_mutex> lock;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  byte in_stack_ffffffffffffff37;
  address_type *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  mount_point *in_stack_ffffffffffffff68;
  byte local_78;
  iterator local_50;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_38 [7];
  
  this_00 = in_RDI;
  booster::shared_lock<booster::shared_mutex>::shared_lock
            ((shared_lock<booster::shared_mutex> *)in_RDI,(shared_mutex *)in_RDI);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
       ::begin((map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                *)in_stack_ffffffffffffff28);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_Rb_tree_const_iterator(local_38,&local_40);
  do {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
         ::end((map<std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<std::shared_ptr<cppcms::mount_point>_>,_std::allocator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                *)in_stack_ffffffffffffff28);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::_Rb_tree_const_iterator(&local_48,&local_50);
    bVar1 = std::operator!=(local_38,&local_48);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_true>
                (this_00,&in_RDI->first,
                 (int *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
LAB_0042bf79:
      booster::shared_lock<booster::shared_mutex>::~shared_lock
                ((shared_lock<booster::shared_mutex> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      return this_00;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)0x42be83);
    std::__shared_ptr_access<cppcms::mount_point,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::mount_point,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x42be8b);
    mount_point::match(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58
                       ,(string *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff37 = local_78;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x42bec4);
    if ((in_stack_ffffffffffffff37 & 1) != 0) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)0x42bed9);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
           in_stack_ffffffffffffff28);
      goto LAB_0042bf79;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::shared_ptr<cppcms::mount_point>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  } while( true );
}

Assistant:

forwarder::address_type forwarder::check_forwading_rules(std::string const &h,std::string const &s,std::string const &p)
	{
		booster::shared_lock<booster::shared_mutex> lock(mutex_);
		for(rules_type::const_iterator it=rules_.begin();it!=rules_.end();++it) {
			if(it->first->match(h,s,p).first)
				return it->second;
		}
		return address_type(std::string(),0);
	}